

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

bool __thiscall CaptureSummary::Merge(CaptureSummary *this,char *list_file_name)

{
  FILE *__stream;
  char *pcVar1;
  size_t __n;
  char **ppcVar2;
  ulong uVar3;
  CaptureSummary **cs;
  CaptureSummary *pCVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char **file_name;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  char buffer [512];
  ulong local_258;
  ulong local_250;
  undefined8 local_240;
  char local_238 [520];
  
  __stream = (FILE *)ithi_file_open(list_file_name,"r");
  bVar10 = __stream != (FILE *)0x0;
  if (bVar10) {
    local_250 = 0;
    file_name = (char **)0x0;
    local_258 = 0;
    local_240 = __stream;
    do {
      pcVar1 = fgets(local_238,0x200,__stream);
      if (pcVar1 == (char *)0x0) {
        if (local_258 < 0x81) {
          bVar10 = Merge(this,local_258,file_name);
        }
        else {
          uVar7 = local_258 + 0x7f;
          uVar3 = uVar7 >> 7;
          cs = (CaptureSummary **)operator_new__(uVar3 * 8);
          bVar10 = true;
          if (0x7f < uVar7) {
            uVar5 = 0;
            uVar8 = 1;
            do {
              pCVar4 = (CaptureSummary *)operator_new(0x20);
              pCVar4->capture_version = 0xcd;
              (pCVar4->summary).
              super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (pCVar4->summary).
              super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (pCVar4->summary).
              super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              uVar6 = uVar5 + 0x80;
              if (local_258 <= uVar5 + 0x80) {
                uVar6 = local_258;
              }
              cs[uVar8 - 1] = pCVar4;
              bVar10 = Merge(pCVar4,uVar6 - uVar5,file_name + uVar5);
            } while ((bVar10) && (bVar9 = uVar8 < uVar3, uVar5 = uVar6, uVar8 = uVar8 + 1, bVar9));
          }
          if (bVar10 != false) {
            bVar10 = Merge(this,uVar3,cs);
          }
          if (0x7f < uVar7) {
            uVar7 = 0;
            do {
              pCVar4 = cs[uVar7];
              if (pCVar4 != (CaptureSummary *)0x0) {
                ~CaptureSummary(pCVar4);
                operator_delete(pCVar4);
                cs[uVar7] = (CaptureSummary *)0x0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar3 != uVar7);
          }
          operator_delete__(cs);
          __stream = local_240;
        }
        break;
      }
      __n = strlen(local_238);
      if (__n != 0) {
LAB_00189fbd:
        if (((ulong)(byte)local_238[__n - 1] < 0x21) &&
           ((0x100002600U >> ((ulong)(byte)local_238[__n - 1] & 0x3f) & 1) != 0))
        goto code_r0x00189fcf;
        ppcVar2 = file_name;
        if (local_250 <= local_258) {
          uVar7 = local_250 * 2;
          if (local_250 == 0) {
            uVar7 = 0x200;
          }
          ppcVar2 = (char **)operator_new__(-(ulong)(uVar7 >> 0x3d != 0) | uVar7 * 8);
          if (local_250 != 0) {
            uVar3 = 0;
            do {
              ppcVar2[uVar3] = file_name[uVar3];
              file_name[uVar3] = (char *)0x0;
              uVar3 = uVar3 + 1;
            } while (local_250 != uVar3);
          }
          if (local_250 <= uVar7 && uVar7 - local_250 != 0) {
            memset(ppcVar2 + local_250,0,(uVar7 - local_250) * 8);
          }
          local_250 = uVar7;
          if (file_name != (char **)0x0) {
            operator_delete__(file_name);
          }
        }
        file_name = ppcVar2;
        pcVar1 = (char *)operator_new__(__n + 1);
        file_name[local_258] = pcVar1;
        memcpy(pcVar1,local_238,__n);
        file_name[local_258][__n] = '\0';
        local_258 = local_258 + 1;
        __stream = local_240;
      }
LAB_0018a0b3:
    } while (__stream != (FILE *)0x0);
  }
  else {
    local_258 = 0;
    file_name = (char **)0x0;
  }
  if (file_name != (char **)0x0) {
    if (local_258 != 0) {
      uVar7 = 0;
      do {
        if (file_name[uVar7] != (char *)0x0) {
          operator_delete__(file_name[uVar7]);
        }
        file_name[uVar7] = (char *)0x0;
        uVar7 = uVar7 + 1;
      } while (local_258 != uVar7);
    }
    operator_delete__(file_name);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  return bVar10;
code_r0x00189fcf:
  local_238[__n] = '\0';
  __n = __n - 1;
  if (__n == 0) goto LAB_0018a0b3;
  goto LAB_00189fbd;
}

Assistant:

bool CaptureSummary::Merge(char const * list_file_name)
{
    size_t nb_alloc = 0;
    char ** file_list = NULL;
    size_t nb_files = 0;
    FILE* F;
    char buffer[512];
    const size_t batch_size = 128;

    /* Open the list file */
    bool ret;
    F = ithi_file_open(list_file_name, "r");
    ret = (F != NULL);

    /* Read each file name and add it to the list */
    while (ret && fgets(buffer, sizeof(buffer), F) != NULL) {
        /* Clean up the end of the buffer */
        size_t len = strlen(buffer);

        while (len > 0 && (buffer[len-1] == ' ' || buffer[len-1] == '\t' || buffer[len-1] == '\r' || buffer[len-1] == '\n')) {
            buffer[len--] = 0;
        }

        if (len == 0)
        {
            continue;
        }

        /* Allocate memory if necessary */
        if (nb_files >= nb_alloc) {
            size_t new_len = (nb_alloc == 0) ? 512 : 2 * nb_alloc;
            char ** new_list = new char*[new_len];

            if (new_list == NULL) {
                ret = false;
            }
            else
            {
                size_t i = 0;
                while (i < nb_alloc){
                    new_list[i] = file_list[i];
                    file_list[i++] = NULL;
                }
                while (i < new_len) {
                    new_list[i++] = NULL;
                }

                if (file_list != NULL) {
                    delete[] file_list;
                }
                file_list = new_list;
                nb_alloc = new_len;
            }
        }

        /* Record the name */
        if (ret)
        {
            file_list[nb_files] = new char[len + 1];
            if (file_list[nb_files] == NULL)
            {
                ret = false;
            }
            else
            {
                memcpy(file_list[nb_files], buffer, len);
                file_list[nb_files][len] = 0;
                nb_files++;
            }
        }
    }


    /* Merge the list */
    if (ret)
    {
        /* Create intermediate merge files if there are more than 100 summaries */
        if (nb_files > batch_size) {
            size_t nb_compiled = 0;
            size_t nb_intermediate_summaries = (nb_files + batch_size - 1) / batch_size;
            size_t nb_created = 0;
            CaptureSummary** intermediate_list = new  CaptureSummary * [nb_intermediate_summaries];

            if (intermediate_list == NULL) {
                ret = false;
            }
            else {
                for (size_t i = 0; ret && i < nb_intermediate_summaries; i++) {
                    intermediate_list[i] = new CaptureSummary();
                    if (intermediate_list[i] == NULL) {
                        ret = false;
                        for (size_t j = nb_created; j < nb_intermediate_summaries; j++) {
                            intermediate_list[j] = NULL;
                        }
                    }
                    else {
                        nb_created++;
                        size_t first_file = nb_compiled;
                        nb_compiled += batch_size;
                        if (nb_compiled > nb_files) {
                            nb_compiled = nb_files;
                        }
                        ret = intermediate_list[i]->Merge(nb_compiled - first_file, (char const**)(file_list + first_file));
                    }
                }

                if (ret) {
                    /* Merge all the summaries */
                    ret = Merge(nb_intermediate_summaries, intermediate_list);
                }
                /* Clean up all the intermediate summaries */
                for (size_t i = 0; i < nb_intermediate_summaries; i++) {
                    if (intermediate_list[i] != NULL) {
                        delete intermediate_list[i];
                        intermediate_list[i] = NULL;
                    }
                }
                delete[] intermediate_list;
            }
        }
        else {
            ret = Merge(nb_files, (char const**)file_list);
        }
    }

    /* Clean up */
    if (file_list != NULL)
    {
        for (size_t i = 0; i < nb_files; i++)
        {
            delete[] file_list[i];
            file_list[i] = NULL;
        }

        delete[] file_list;
    }

    if (F != NULL)
    {
        fclose(F);
    }

    return ret;
}